

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O2

void auto_tile_size_balancing(AV1_COMMON *cm,int num_sbs,int num_tiles_lg,int tile_col_row)

{
  int iVar1;
  byte bVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  
  bVar2 = (byte)num_tiles_lg;
  iVar4 = num_sbs >> (bVar2 & 0x1f);
  iVar5 = iVar4 << (bVar2 & 0x1f);
  (cm->tiles).uniform_spacing = 0;
  piVar3 = (cm->tiles).col_start_sb;
  if (tile_col_row == 0) {
    piVar3 = (cm->tiles).row_start_sb;
  }
  iVar7 = 0;
  for (uVar6 = 0; (iVar7 < num_sbs && (uVar6 < 0x40)); uVar6 = uVar6 + 1) {
    iVar4 = iVar4 + (uint)((uint)(((1 << (bVar2 & 0x1f)) - num_sbs) + iVar5) == uVar6);
    piVar3[uVar6] = iVar7;
    iVar1 = (cm->tiles).max_width_sb;
    if (iVar4 < iVar1) {
      iVar1 = iVar4;
    }
    iVar7 = iVar7 + iVar1;
  }
  (cm->tiles).col_start_sb[(ulong)(tile_col_row == 0) - 0xf] = (int)uVar6;
  piVar3[uVar6] = num_sbs;
  return;
}

Assistant:

static void auto_tile_size_balancing(AV1_COMMON *const cm, int num_sbs,
                                     int num_tiles_lg, int tile_col_row) {
  CommonTileParams *const tiles = &cm->tiles;
  int i, start_sb;
  int size_sb = num_sbs >> num_tiles_lg;
  int res_sbs = num_sbs - (size_sb << num_tiles_lg);
  int num_tiles = 1 << num_tiles_lg;
  int inc_index = num_tiles - res_sbs;

  tiles->uniform_spacing = 0;

  for (i = 0, start_sb = 0; start_sb < num_sbs && i < MAX_TILE_COLS; ++i) {
    if (i == inc_index) ++size_sb;
    if (tile_col_row)
      tiles->col_start_sb[i] = start_sb;
    else
      tiles->row_start_sb[i] = start_sb;

    start_sb += AOMMIN(size_sb, tiles->max_width_sb);
  }

  if (tile_col_row) {
    tiles->cols = i;
    tiles->col_start_sb[i] = num_sbs;
  } else {
    tiles->rows = i;
    tiles->row_start_sb[i] = num_sbs;
  }
}